

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

size_t __thiscall
ninx::parser::element::Block::__add_late_call
          (Block *this,
          unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
          *descriptor)

{
  mapped_type *this_00;
  value_type local_40;
  size_type local_20;
  size_t segment_position;
  unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
  *descriptor_local;
  Block *this_local;
  
  segment_position = (size_t)descriptor;
  descriptor_local =
       (unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
        *)this;
  local_20 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&this->__output_segments);
  std::__cxx11::string::string((string *)&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->__output_segments,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = std::
            map<unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>_>_>
            ::operator[](&this->__late_calls,&local_20);
  std::
  unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
  ::operator=(this_00,descriptor);
  return local_20;
}

Assistant:

size_t ninx::parser::element::Block::__add_late_call(std::unique_ptr<ninx::parser::util::LateCallDescriptor> descriptor) {
    size_t segment_position = __output_segments.size();

    // Add an empty string
    __output_segments.push_back(std::move(std::string()));

    // Add the late call reference
    __late_calls[segment_position] = std::move(descriptor);

    return segment_position;
}